

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printStateVariables(PrinterStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Role RVar2;
  pool_ref<soul::heart::Variable> *ppVar3;
  CodePrinter *pCVar4;
  string *name;
  Expression *e;
  size_t sVar5;
  int line;
  char *pcVar6;
  PrinterStream *this_00;
  pointer ppVar7;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> variables;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  char s_1 [2];
  VariableListByType list;
  char local_ba [2];
  string local_b8;
  PrinterStream *local_98;
  char *local_90;
  char *local_88;
  pointer local_80;
  string local_78;
  pointer local_58;
  pointer local_50;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  local_48;
  
  ppVar3 = (this->module->stateVariables).stateVariables.items;
  variables.e = ppVar3 + (this->module->stateVariables).stateVariables.numActive;
  variables.s = ppVar3;
  Utilities::VariableListByType::VariableListByType((VariableListByType *)&local_48,variables);
  local_58 = local_48.
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_b8.field_2;
    local_88 = "operator const std::basic_string<char> &";
    local_90 = "isValid()";
    local_98 = this;
    do {
      ppVar7 = ((local_48.
                 super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                 ._M_impl.super__Vector_impl_data._M_start)->variables).
               super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_50 = ((local_48.
                   super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                   ._M_impl.super__Vector_impl_data._M_start)->variables).
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_80 = local_48.
                 super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar7 != local_50) {
        do {
          pCVar4 = this->out;
          RVar2 = ppVar7->object->role;
          pcVar6 = "var ";
          if (RVar2 == constant) {
            pcVar6 = "let ";
          }
          if (RVar2 == external) {
            pcVar6 = "let external ";
          }
          text._M_len = (ulong)(RVar2 == external) * 9 + 4;
          text._M_str = pcVar6;
          choc::text::CodePrinter::writeBlock(pCVar4,text);
          getTypeDescription_abi_cxx11_(&local_78,this,&local_80->type);
          text_00._M_str._2_6_ = local_78._M_dataplus._M_p._2_6_;
          text_00._M_str._0_2_ = local_78._M_dataplus._M_p._0_2_;
          text_00._M_len = local_78._M_string_length;
          choc::text::CodePrinter::writeBlock(pCVar4,text_00);
          local_ba[0] = ' ';
          local_ba[1] = '\0';
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          sVar5 = strlen(local_ba);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,local_ba,local_ba + sVar5);
          choc::text::CodePrinter::append(pCVar4,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT62(local_b8.field_2._M_allocated_capacity._2_6_,
                                     local_b8.field_2._M_allocated_capacity._0_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_
                                    ),local_78.field_2._M_allocated_capacity + 1);
          }
          this_00 = local_98;
          name = (ppVar7->object->name).name;
          if (name == (string *)0x0) {
            line = 0x21;
LAB_0025eea6:
            throwInternalCompilerError(local_90,local_88,line);
          }
          printVarWithPrefix(local_98,name);
          if ((ppVar7->object->initialValue).object != (Expression *)0x0) {
            text_01._M_str = " = ";
            text_01._M_len = 3;
            choc::text::CodePrinter::writeBlock(this_00->out,text_01);
            this_00 = local_98;
            e = (ppVar7->object->initialValue).object;
            if (e == (Expression *)0x0) {
              line = 0x3b;
              local_90 = "object != nullptr";
              local_88 = "operator*";
              goto LAB_0025eea6;
            }
            printExpression(local_98,e);
          }
          printDescription(this_00,&ppVar7->object->annotation);
          pCVar4 = this_00->out;
          local_78._M_dataplus._M_p._0_2_ = 0x3b;
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          sVar5 = strlen((char *)&local_78);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,&local_78,(long)&local_78._M_dataplus._M_p + sVar5);
          choc::text::CodePrinter::append(pCVar4,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT62(local_b8.field_2._M_allocated_capacity._2_6_,
                                     local_b8.field_2._M_allocated_capacity._0_2_) + 1);
          }
          local_b8.field_2._M_allocated_capacity._0_2_ = 10;
          local_b8._M_string_length = 1;
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          choc::text::CodePrinter::append(pCVar4,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT62(local_b8.field_2._M_allocated_capacity._2_6_,
                                     local_b8.field_2._M_allocated_capacity._0_2_) + 1);
          }
          ppVar7 = ppVar7 + 1;
          this = local_98;
        } while (ppVar7 != local_50);
      }
      local_48.
      super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
      ._M_impl.super__Vector_impl_data._M_start = local_80 + 1;
    } while (local_48.
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_start != local_58);
  }
  std::
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void printStateVariables()
        {
            heart::Utilities::VariableListByType list (module.stateVariables.get());

            for (auto& type : list.types)
            {
                for (auto& v : type.variables)
                {
                    out << (v->isExternal() ? "let external " : (v->isConstant() ? "let " : "var "))
                        << getTypeDescription (type.type) << ' ';

                    printVarWithPrefix (v->name);

                    if (v->initialValue != nullptr)
                    {
                        out << " = ";
                        printExpression (*v->initialValue);
                    }

                    printDescription (v->annotation);
                    out << ';' << newLine;
                }
            }
        }